

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O2

void __thiscall QGroupBox::setChecked(QGroupBox *this,bool b)

{
  QGroupBoxPrivate *this_00;
  long in_FS_OFFSET;
  code *local_48;
  undefined8 local_40;
  QGroupBox *pQStack_38;
  undefined8 local_30;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGroupBoxPrivate **)&(this->super_QWidget).field_0x8;
  if ((this_00->checkable == true) && (this_00->checked != b)) {
    QWidget::update(&this->super_QWidget);
    this_00->checked = b;
    QGroupBoxPrivate::_q_setChildrenEnabled(this_00,b);
    local_30 = 0xaaaaaaaaffffffff;
    local_48 = QCss::ValueExtractor::extractGeometry;
    local_28 = 0x40;
    local_40 = 0xaaaaaaaa0000800a;
    pQStack_38 = this;
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_48);
    toggled(this,b);
    QAccessibleStateChangeEvent::~QAccessibleStateChangeEvent
              ((QAccessibleStateChangeEvent *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGroupBox::setChecked(bool b)
{
    Q_D(QGroupBox);
    if (d->checkable && b != d->checked) {
        update();
        d->checked = b;
        d->_q_setChildrenEnabled(b);
#if QT_CONFIG(accessibility)
        QAccessible::State st;
        st.checked = true;
        QAccessibleStateChangeEvent e(this, st);
        QAccessible::updateAccessibility(&e);
#endif
        emit toggled(b);
    }
}